

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O0

void statistics(string *clusters_path)

{
  byte bVar1;
  reference pvVar2;
  ostream *poVar3;
  ostream *poVar4;
  _Ios_Openmode in_EDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t j;
  int i_1;
  uint64_t cumulative;
  int i;
  uint64_t max;
  uint16_t length;
  uint64_t start;
  uint64_t max_len;
  vector<unsigned_long,_std::allocator<unsigned_long>_> clust_len_freq;
  uint64_t MAX_C_LEN;
  ifstream clusters;
  allocator_type *in_stack_fffffffffffffcb8;
  value_type_conflict *in_stack_fffffffffffffcc0;
  size_type in_stack_fffffffffffffcc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcd0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_290;
  int local_284;
  long local_280;
  int local_274;
  ulong local_270;
  ushort local_262;
  undefined1 local_260 [8];
  ulong local_258;
  undefined8 local_248;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_240;
  ulong local_228;
  string local_210 [520];
  _Ios_Openmode local_8;
  
  local_8 = in_EDI;
  std::ifstream::ifstream(local_210);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_210,local_8);
  local_228 = (ulong)max_clust_length;
  local_248 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x11df15);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x11df49);
  local_258 = 0;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::istream::read((char *)local_210,(long)local_260);
    std::istream::read((char *)local_210,(long)&local_262);
    if (local_262 <= local_228) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_240,(ulong)local_262);
      *pvVar2 = *pvVar2 + 1;
      if (local_258 < local_262) {
        local_2c0 = (ulong)local_262;
      }
      else {
        local_2c0 = local_258;
      }
      local_258 = local_2c0;
    }
    n_clust = n_clust + 1;
    n_bases = local_262 + n_bases;
  }
  local_270 = 0;
  for (local_274 = 1; (ulong)(long)local_274 <= local_228; local_274 = local_274 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_240,(long)local_274);
    if (*pvVar2 * (long)local_274 < local_270 || *pvVar2 * (long)local_274 - local_270 == 0) {
      local_2c8 = local_270;
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_240,(long)local_274);
      local_2c8 = *pvVar2 * (long)local_274;
    }
    local_270 = local_2c8;
  }
  local_280 = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"\nDistribution of base coverage: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\ncluster length\t# bases in a cluster with this length\t cumulative fraction (from 2m = "
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,mcov_out * 2);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_284 = 0; (ulong)(long)local_284 <= local_258; local_284 = local_284 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_284);
    poVar3 = std::operator<<(poVar3,"\t");
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    for (local_290 = 0;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_240,(long)local_284),
        local_290 < (*pvVar2 * 100 * (long)local_284) / local_270; local_290 = local_290 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"-");
      std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"\t");
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_240,(long)local_284);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2 * (long)local_284);
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    if (SBORROW4(local_284,mcov_out * 2) == local_284 + mcov_out * -2 < 0) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_240,(long)local_284);
      local_280 = local_280 + *pvVar2 * (long)local_284;
      poVar3 = std::operator<<((ostream *)&std::cout,"\t");
      auVar5._8_4_ = (int)((ulong)local_280 >> 0x20);
      auVar5._0_8_ = local_280;
      auVar5._12_4_ = 0x45300000;
      auVar7._8_4_ = (int)(n_bases >> 0x20);
      auVar7._0_8_ = n_bases;
      auVar7._12_4_ = 0x45300000;
      std::ostream::operator<<
                (poVar3,((auVar5._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_280) - 4503599627370496.0)) /
                        ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)n_bases) - 4503599627370496.0)));
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  max_clust_length = mcov_out << 1;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&local_240,(long)max_clust_length);
  local_280 = *pvVar2 * (long)max_clust_length;
  while (auVar8._8_4_ = (int)((ulong)local_280 >> 0x20), auVar8._0_8_ = local_280,
        auVar8._12_4_ = 0x45300000, auVar6._8_4_ = (int)(n_bases >> 0x20), auVar6._0_8_ = n_bases,
        auVar6._12_4_ = 0x45300000,
        ((auVar8._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)local_280) - 4503599627370496.0)) /
        ((auVar6._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)n_bases) - 4503599627370496.0)) < pval &&
        (ulong)(long)max_clust_length < local_228) {
    max_clust_length = max_clust_length + 1;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_240,(long)max_clust_length);
    local_280 = *pvVar2 * (long)max_clust_length + local_280;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\nCluster sizes allowed: [");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,mcov_out * 2);
  poVar3 = std::operator<<(poVar3,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar3,max_clust_length);
  poVar4 = std::operator<<(poVar4,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ifstream::close();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)poVar3);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void statistics(string & clusters_path){

	ifstream clusters;
	clusters.open(clusters_path, ios::in | ios::binary);

	uint64_t MAX_C_LEN = max_clust_length;

	//init with max cluster length 200
	auto clust_len_freq = vector<uint64_t>(MAX_C_LEN+1,0);

	uint64_t max_len = 0;

	while(not clusters.eof()){

		//read entry in clusters

		uint64_t start;
		uint16_t length;

		clusters.read((char*)&start, sizeof(uint64_t));
		clusters.read((char*)&length, sizeof(uint16_t));

		if(length <= MAX_C_LEN){

			clust_len_freq[length]++;
			max_len = length>max_len ? length : max_len;

		}

		n_clust++;
		n_bases+=length;

	}

	uint64_t max = 0;
	for(int i=1;i<=MAX_C_LEN;++i) max = clust_len_freq[i]*i > max ? clust_len_freq[i]*i : max;

	uint64_t cumulative = 0;

	cout << "\nDistribution of base coverage: "<< endl;
	cout << "\ncluster length\t# bases in a cluster with this length\t cumulative fraction (from 2m = " << 2*mcov_out << ")" << endl;
	for(int i=0;i<=max_len;++i){

		cout << i << "\t" << flush;
		for(uint64_t j=0;j<(100*clust_len_freq[i]*i)/max;++j) cout << "-" << flush;
		cout << "\t" << clust_len_freq[i]*i << flush;

		if(i>=2*mcov_out){

			cumulative += clust_len_freq[i]*i;
			cout << "\t" << double(cumulative)/double(n_bases);

		}

		cout << endl;


	}

	//auto-detect max cluster length

	max_clust_length = 2*mcov_out;//start from the minimum cluster length
	cumulative = clust_len_freq[max_clust_length]*max_clust_length;//cumulative number of bases

	while( double(cumulative)/double(n_bases) < pval and  max_clust_length < MAX_C_LEN){

		max_clust_length++;
		cumulative += clust_len_freq[max_clust_length]*max_clust_length;

	}

/*	max = 0;
	for(int i=1;i<=MAX_C_LEN;++i) max = clust_len_freq[i] > max ? clust_len_freq[i] : max;

	cout << "\nDistribution of cluster length: "<< endl;
	cout << "\ncluster length\t# clusters with this length" << endl;
	for(int i=0;i<=max_len;++i){

		cout << i << "\t" << flush;
		for(uint64_t j=0;j<(100*clust_len_freq[i])/max;++j) cout << "-" << flush;
		cout << "   " << clust_len_freq[i] << endl;


	}*/

	cout << "\nCluster sizes allowed: [" << mcov_out*2 << "," << max_clust_length << "]" << endl;

	clusters.close();

}